

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O2

void relink_timers(boolean ghostly,level *lev)

{
  boolean bVar1;
  ulong in_RAX;
  obj *poVar2;
  timer_element *ptVar3;
  uint nid;
  undefined8 uStack_38;
  
  ptVar3 = (timer_element *)&lev->lev_timers;
  uStack_38 = in_RAX;
  while( true ) {
    do {
      ptVar3 = ptVar3->next;
      if (ptVar3 == (timer_element *)0x0) {
        return;
      }
    } while ((ptVar3->field_0x1b & 1) == 0);
    if (ptVar3->kind != 2) {
      panic("relink_timers 2");
    }
    if (ghostly == '\0') {
      uStack_38 = CONCAT44(*(uint *)&ptVar3->arg,(undefined4)uStack_38);
    }
    else {
      bVar1 = lookup_id_mapping(*(uint *)&ptVar3->arg,(uint *)((long)&uStack_38 + 4));
      if (bVar1 == '\0') {
        panic("relink_timers 1");
      }
    }
    poVar2 = find_oid(lev,uStack_38._4_4_);
    ptVar3->arg = poVar2;
    if (poVar2 == (obj *)0x0) break;
    ptVar3->field_0x1b = ptVar3->field_0x1b & 0xfe;
  }
  panic("cant find o_id %d",uStack_38 >> 0x20);
}

Assistant:

void relink_timers(boolean ghostly, struct level *lev)
{
    timer_element *curr;
    unsigned nid;

    for (curr = lev->lev_timers; curr; curr = curr->next) {
	if (curr->needs_fixup) {
	    if (curr->kind == TIMER_OBJECT) {
		if (ghostly) {
		    if (!lookup_id_mapping((long)curr->arg, &nid))
			panic("relink_timers 1");
		} else
		    nid = (long) curr->arg;
		curr->arg = find_oid(lev, nid);
		if (!curr->arg) panic("cant find o_id %d", nid);
		curr->needs_fixup = 0;
	    } else
		panic("relink_timers 2");
	}
    }
}